

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

ConstTokenOrSyntax * __thiscall
slang::syntax::DeferredAssertionSyntax::getChild
          (ConstTokenOrSyntax *__return_storage_ptr__,DeferredAssertionSyntax *this,size_t index)

{
  Token token;
  Token token_00;
  Token token_01;
  size_t index_local;
  DeferredAssertionSyntax *this_local;
  
  if (index == 0) {
    token.kind = (this->hash).kind;
    token._2_1_ = (this->hash).field_0x2;
    token.numFlags.raw = (this->hash).numFlags.raw;
    token.rawLen = (this->hash).rawLen;
    token.info = (this->hash).info;
    ConstTokenOrSyntax::ConstTokenOrSyntax(__return_storage_ptr__,token);
  }
  else if (index == 1) {
    token_00.kind = (this->zero).kind;
    token_00._2_1_ = (this->zero).field_0x2;
    token_00.numFlags.raw = (this->zero).numFlags.raw;
    token_00.rawLen = (this->zero).rawLen;
    token_00.info = (this->zero).info;
    ConstTokenOrSyntax::ConstTokenOrSyntax(__return_storage_ptr__,token_00);
  }
  else if (index == 2) {
    token_01.kind = (this->finalKeyword).kind;
    token_01._2_1_ = (this->finalKeyword).field_0x2;
    token_01.numFlags.raw = (this->finalKeyword).numFlags.raw;
    token_01.rawLen = (this->finalKeyword).rawLen;
    token_01.info = (this->finalKeyword).info;
    ConstTokenOrSyntax::ConstTokenOrSyntax(__return_storage_ptr__,token_01);
  }
  else {
    ConstTokenOrSyntax::ConstTokenOrSyntax(__return_storage_ptr__,(nullptr_t)0x0);
  }
  return __return_storage_ptr__;
}

Assistant:

ConstTokenOrSyntax DeferredAssertionSyntax::getChild(size_t index) const {
    switch (index) {
        case 0: return hash;
        case 1: return zero;
        case 2: return finalKeyword;
        default: return nullptr;
    }
}